

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void computeYMD(DateTime *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  double dVar5;
  
  if (p->validYMD != '\0') {
    return;
  }
  if (p->validJD == '\0') {
    iVar3 = 1;
    iVar2 = 2000;
    iVar1 = iVar3;
  }
  else {
    iVar1 = (int)((p->iJD + 43200000) / 86400000);
    iVar3 = (int)(((double)iVar1 + -1867216.25) / 36524.25);
    iVar3 = iVar1 + iVar3 + iVar3 / -4 + 0x5f5;
    uVar4 = (uint)(((double)iVar3 + -122.1) / 365.25);
    iVar3 = iVar3 - ((uVar4 & 0x7fff) * 0x8ead) / 100;
    dVar5 = (double)iVar3 / 30.6001;
    iVar1 = (int)dVar5;
    iVar3 = iVar3 - (int)((double)(int)dVar5 * 30.6001);
    iVar1 = (-(uint)(iVar1 < 0xe) | 0xfffffff3) + iVar1;
    iVar2 = (2 < iVar1 ^ 0xffffed95) + uVar4;
  }
  p->Y = iVar2;
  p->M = iVar1;
  p->D = iVar3;
  p->validYMD = '\x01';
  return;
}

Assistant:

static void computeYMD(DateTime *p){
  int Z, A, B, C, D, E, X1;
  if( p->validYMD ) return;
  if( !p->validJD ){
    p->Y = 2000;
    p->M = 1;
    p->D = 1;
  }else{
    assert( validJulianDay(p->iJD) );
    Z = (int)((p->iJD + 43200000)/86400000);
    A = (int)((Z - 1867216.25)/36524.25);
    A = Z + 1 + A - (A/4);
    B = A + 1524;
    C = (int)((B - 122.1)/365.25);
    D = (36525*(C&32767))/100;
    E = (int)((B-D)/30.6001);
    X1 = (int)(30.6001*E);
    p->D = B - D - X1;
    p->M = E<14 ? E-1 : E-13;
    p->Y = p->M>2 ? C - 4716 : C - 4715;
  }
  p->validYMD = 1;
}